

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_epoll.c
# Opt level: O1

void epoll_poll(ev_loop *loop,ev_tstamp timeout)

{
  byte bVar1;
  ANFD *pAVar2;
  epoll_event *peVar3;
  undefined8 uVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  epoll_event *__event;
  int iVar8;
  long lVar9;
  uint uVar10;
  
  if (loop->epoll_epermcnt != 0) {
    timeout = 0.0;
  }
  if (loop->release_cb != (_func_void_ev_loop_ptr *)0x0) {
    (*loop->release_cb)(loop);
  }
  uVar6 = epoll_wait(loop->backend_fd,(epoll_event *)loop->epoll_events,loop->epoll_eventmax,
                     (int)(timeout * 1000.0));
  if (loop->acquire_cb != (_func_void_ev_loop_ptr *)0x0) {
    (*loop->acquire_cb)(loop);
  }
  if ((int)uVar6 < 0) {
    epoll_poll_cold_2();
  }
  else {
    if (uVar6 != 0) {
      lVar9 = 0;
      do {
        pAVar2 = loop->anfds;
        peVar3 = loop->epoll_events;
        uVar4 = *(undefined8 *)((long)&peVar3->data + lVar9);
        iVar8 = (int)uVar4;
        uVar10 = *(uint *)((long)&peVar3->events + lVar9);
        if (pAVar2[iVar8].egen == (uint)((ulong)uVar4 >> 0x20)) {
          bVar1 = pAVar2[iVar8].events;
          uVar10 = (uint)((uVar10 & 0x19) != 0) + (uint)((uVar10 & 0x1c) != 0) * 2;
          if ((uVar10 & ~(uint)bVar1) != 0) {
            __event = (epoll_event *)((long)&peVar3->events + lVar9);
            pAVar2[iVar8].emask = bVar1;
            __event->events = (bVar1 & 1) + (bVar1 & 2) * 2;
            iVar7 = epoll_ctl(loop->backend_fd,3 - (uint)(bVar1 == 0),iVar8,__event);
            if (iVar7 != 0) goto LAB_001097fd;
          }
          fd_event(loop,iVar8,uVar10);
        }
        else {
LAB_001097fd:
          loop->postfork = loop->postfork | 2;
        }
        lVar9 = lVar9 + 0xc;
      } while ((ulong)uVar6 * 0xc != lVar9);
    }
    if (uVar6 == loop->epoll_eventmax) {
      epoll_poll_cold_1();
    }
    for (lVar9 = (long)loop->epoll_epermcnt; lVar9 != 0; lVar9 = lVar9 + -1) {
      pAVar2 = loop->anfds;
      piVar5 = loop->epoll_eperms;
      iVar8 = piVar5[lVar9 + -1];
      if (((char)pAVar2[iVar8].emask < '\0') &&
         (uVar6 = pAVar2[iVar8].events & 3, (char)uVar6 != '\0')) {
        fd_event(loop,iVar8,uVar6);
      }
      else {
        iVar7 = loop->epoll_epermcnt;
        loop->epoll_epermcnt = iVar7 + -1;
        piVar5[lVar9 + -1] = piVar5[(long)iVar7 + -1];
        pAVar2[iVar8].emask = '\0';
      }
    }
  }
  return;
}

Assistant:

static void
epoll_poll (EV_P_ ev_tstamp timeout)
{
  int i;
  int eventcnt;

  if (expect_false (epoll_epermcnt))
    timeout = 0.;

  /* epoll wait times cannot be larger than (LONG_MAX - 999UL) / HZ msecs, which is below */
  /* the default libev max wait time, however. */
  EV_RELEASE_CB;
  eventcnt = epoll_wait (backend_fd, epoll_events, epoll_eventmax, timeout * 1e3);
  EV_ACQUIRE_CB;

  if (expect_false (eventcnt < 0))
    {
      if (errno != EINTR)
        ev_syserr ("(libev) epoll_wait");

      return;
    }

  for (i = 0; i < eventcnt; ++i)
    {
      struct epoll_event *ev = epoll_events + i;

      int fd = (uint32_t)ev->data.u64; /* mask out the lower 32 bits */
      int want = anfds [fd].events;
      int got  = (ev->events & (EPOLLOUT | EPOLLERR | EPOLLHUP) ? EV_WRITE : 0)
               | (ev->events & (EPOLLIN  | EPOLLERR | EPOLLHUP) ? EV_READ  : 0);

      /*
       * check for spurious notification.
       * this only finds spurious notifications on egen updates
       * other spurious notifications will be found by epoll_ctl, below
       * we assume that fd is always in range, as we never shrink the anfds array
       */
      if (expect_false ((uint32_t)anfds [fd].egen != (uint32_t)(ev->data.u64 >> 32)))
        {
          /* recreate kernel state */
          postfork |= 2;
          continue;
        }

      if (expect_false (got & ~want))
        {
          anfds [fd].emask = want;

          /*
           * we received an event but are not interested in it, try mod or del
           * this often happens because we optimistically do not unregister fds
           * when we are no longer interested in them, but also when we get spurious
           * notifications for fds from another process. this is partially handled
           * above with the gencounter check (== our fd is not the event fd), and
           * partially here, when epoll_ctl returns an error (== a child has the fd
           * but we closed it).
           */
          ev->events = (want & EV_READ  ? EPOLLIN  : 0)
                     | (want & EV_WRITE ? EPOLLOUT : 0);

          /* pre-2.6.9 kernels require a non-null pointer with EPOLL_CTL_DEL, */
          /* which is fortunately easy to do for us. */
          if (epoll_ctl (backend_fd, want ? EPOLL_CTL_MOD : EPOLL_CTL_DEL, fd, ev))
            {
              postfork |= 2; /* an error occurred, recreate kernel state */
              continue;
            }
        }

      fd_event (EV_A_ fd, got);
    }

  /* if the receive array was full, increase its size */
  if (expect_false (eventcnt == epoll_eventmax))
    {
      ev_free (epoll_events);
      epoll_eventmax = array_nextsize (sizeof (struct epoll_event), epoll_eventmax, epoll_eventmax + 1);
      epoll_events = (struct epoll_event *)ev_malloc (sizeof (struct epoll_event) * epoll_eventmax);
    }

  /* now synthesize events for all fds where epoll fails, while select works... */
  for (i = epoll_epermcnt; i--; )
    {
      int fd = epoll_eperms [i];
      unsigned char events = anfds [fd].events & (EV_READ | EV_WRITE);

      if (anfds [fd].emask & EV_EMASK_EPERM && events)
        fd_event (EV_A_ fd, events);
      else
        {
          epoll_eperms [i] = epoll_eperms [--epoll_epermcnt];
          anfds [fd].emask = 0;
        }
    }
}